

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

void __thiscall smf::MidiFile::MidiFile(MidiFile *this,MidiFile *other)

{
  MidiFile *other_local;
  MidiFile *this_local;
  
  std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::vector(&this->m_events);
  this->m_ticksPerQuarterNote = 0x78;
  this->m_theTrackState = 0;
  this->m_theTimeState = 1;
  std::__cxx11::string::string((string *)&this->m_readFileName);
  this->m_timemapvalid = false;
  std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::vector(&this->m_timemap);
  this->m_rwstatus = true;
  this->m_linkedEventsQ = false;
  operator=(this,other);
  return;
}

Assistant:

MidiFile::MidiFile(MidiFile&& other) {
	*this = std::move(other);
}